

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeViewPrivate::itemDecorationAt(QTreeViewPrivate *this,QPoint *pos)

{
  QTreeView *this_00;
  Data *pDVar1;
  QTreeViewItem *pQVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long in_FS_OFFSET;
  QModelIndex ret;
  QModelIndex local_60;
  undefined8 local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  pDVar1 = (this->spanningIndexes).q_hash.d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&(this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame
                           .super_QWidget + 0x1f0))(&local_48,this_00,pos);
    uVar7 = (uint)local_48;
    if (local_38.ptr != (QAbstractItemModel *)0x0 && -1 < (int)(local_48._4_4_ | (uint)local_48)) {
      (**(code **)(*(long *)local_38.ptr + 0x68))(&local_60,local_38.ptr,&local_48);
      bVar3 = QTreeView::isFirstColumnSpanned(this_00,uVar7,&local_60);
      iVar9 = 0;
      if (bVar3) goto LAB_0059f9af;
    }
  }
  iVar9 = QHeaderView::logicalIndexAt(this->header,(pos->xp).m_i);
LAB_0059f9af:
  iVar5 = this->treePosition;
  if (iVar5 < 0) {
    iVar5 = QHeaderView::logicalIndex(this->header,0);
  }
  uVar7 = 0xffffffff;
  if (iVar5 == iVar9) {
    uVar6 = itemAtCoordinate(this,(pos->yp).m_i);
    if (((int)uVar6 < 0) || (uVar8 = (ulong)uVar6, (ulong)(this->viewItems).d.size <= uVar8)) {
      local_48 = (undefined1 *)0xffffffffffffffff;
      puStack_40 = (undefined1 *)0x0;
      local_38.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      pQVar2 = (this->viewItems).d.ptr;
      local_38.ptr = pQVar2[uVar8].index.m.ptr;
      pQVar2 = pQVar2 + uVar8;
      local_48 = *(undefined1 **)&pQVar2->index;
      puStack_40 = (undefined1 *)(pQVar2->index).i;
    }
    local_60._0_16_ = itemDecorationRect(this,(QModelIndex *)&local_48);
    cVar4 = QRect::contains((QPoint *)&local_60,SUB81(pos,0));
    uVar7 = 0xffffffff;
    if (cVar4 != '\0') {
      uVar7 = uVar6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar7;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeViewPrivate::itemDecorationAt(const QPoint &pos) const
{
    Q_Q(const QTreeView);
    executePostedLayout();
    bool spanned = false;
    if (!spanningIndexes.isEmpty()) {
        const QModelIndex index = q->indexAt(pos);
        if (index.isValid())
            spanned = q->isFirstColumnSpanned(index.row(), index.parent());
    }
    const int column = spanned ? 0 : header->logicalIndexAt(pos.x());
    if (!isTreePosition(column))
        return -1; // no logical index at x

    int viewItemIndex = itemAtCoordinate(pos.y());
    QRect returning = itemDecorationRect(modelIndex(viewItemIndex));
    if (!returning.contains(pos))
        return -1;

    return viewItemIndex;
}